

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

gzFile gz_open(char *path,char *mode,int fd)

{
  uLong uVar1;
  size_t sVar2;
  void *pvVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  int in_EDX;
  undefined8 **ppuVar7;
  char *in_RSI;
  char *in_RDI;
  char *m;
  char fmode [80];
  gz_stream *s;
  char *p;
  int strategy;
  int level;
  int err;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  z_streamp in_stack_ffffffffffffff58;
  FILE *local_a0;
  bool local_91;
  undefined8 **ppuVar8;
  int in_stack_ffffffffffffff78;
  undefined8 *local_38;
  char *local_30;
  undefined4 local_28;
  int local_24;
  int local_20;
  int local_1c;
  char *local_10;
  undefined8 *local_8;
  
  local_24 = -1;
  local_28 = 0;
  ppuVar8 = (undefined8 **)&stack0xffffffffffffff78;
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    local_30 = in_RSI;
    local_1c = in_EDX;
    local_10 = in_RDI;
    local_38 = (undefined8 *)malloc(0xd0);
    if (local_38 == (undefined8 *)0x0) {
      local_8 = (undefined8 *)0x0;
    }
    else {
      local_38[8] = 0;
      local_38[9] = 0;
      local_38[10] = 0;
      local_38[0x10] = 0;
      *local_38 = 0;
      local_38[0x11] = 0;
      local_38[3] = 0;
      *(undefined4 *)(local_38 + 4) = 0;
      *(undefined4 *)(local_38 + 1) = 0;
      local_38[0xf] = 0;
      *(undefined4 *)(local_38 + 0xe) = 0;
      *(undefined4 *)((long)local_38 + 0x74) = 0;
      local_38[0x17] = 0;
      local_38[0x18] = 0;
      *(undefined4 *)(local_38 + 0x19) = 0xffffffff;
      uVar1 = crc32(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                    (uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_38[0x12] = uVar1;
      local_38[0x13] = 0;
      *(undefined4 *)(local_38 + 0x15) = 0;
      sVar2 = strlen(local_10);
      pvVar3 = malloc(sVar2 + 1);
      local_38[0x14] = pvVar3;
      if (local_38[0x14] == 0) {
        destroy((gz_stream *)in_stack_ffffffffffffff28);
        local_8 = (undefined8 *)0x0;
      }
      else {
        strcpy((char *)local_38[0x14],local_10);
        *(undefined1 *)((long)local_38 + 0xac) = 0;
        do {
          if (*local_30 == 'r') {
            *(undefined1 *)((long)local_38 + 0xac) = 0x72;
          }
          if ((*local_30 == 'w') || (*local_30 == 'a')) {
            *(undefined1 *)((long)local_38 + 0xac) = 0x77;
          }
          ppuVar7 = ppuVar8;
          if ((*local_30 < '0') || ('9' < *local_30)) {
            if (*local_30 == 'f') {
              local_28 = 1;
            }
            else if (*local_30 == 'h') {
              local_28 = 2;
            }
            else if (*local_30 == 'R') {
              local_28 = 3;
            }
            else {
              ppuVar7 = (undefined8 **)((long)ppuVar8 + 1);
              *(char *)ppuVar8 = *local_30;
            }
          }
          else {
            local_24 = *local_30 + -0x30;
          }
          pcVar6 = local_30 + 1;
          local_91 = *local_30 != '\0' && ppuVar7 != &local_38;
          ppuVar8 = ppuVar7;
          local_30 = pcVar6;
        } while (local_91);
        if (*(char *)((long)local_38 + 0xac) == '\0') {
          destroy((gz_stream *)in_stack_ffffffffffffff28);
          local_8 = (undefined8 *)0x0;
        }
        else {
          if (*(char *)((long)local_38 + 0xac) == 'w') {
            in_stack_ffffffffffffff28 = "1.2.3";
            local_20 = deflateInit2_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                     (char *)ppuVar7,in_stack_ffffffffffffff78);
            pvVar3 = malloc(0x4000);
            local_38[0x11] = pvVar3;
            local_38[3] = pvVar3;
            if ((local_20 != 0) || (local_38[0x11] == 0)) {
              destroy((gz_stream *)in_stack_ffffffffffffff28);
              return (gzFile)0x0;
            }
          }
          else {
            pvVar3 = malloc(0x4000);
            local_38[0x10] = pvVar3;
            *local_38 = pvVar3;
            local_20 = inflateInit2_((z_streamp)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                     in_stack_ffffffffffffff44,
                                     (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                      in_stack_ffffffffffffff38),
                                     in_stack_ffffffffffffff34);
            if ((local_20 != 0) || (local_38[0x10] == 0)) {
              destroy((gz_stream *)in_stack_ffffffffffffff28);
              return (gzFile)0x0;
            }
            local_20 = 0;
          }
          *(undefined4 *)(local_38 + 4) = 0x4000;
          piVar4 = __errno_location();
          *piVar4 = 0;
          if (local_1c < 0) {
            local_a0 = fopen(local_10,&stack0xffffffffffffff78);
          }
          else {
            local_a0 = fdopen(local_1c,&stack0xffffffffffffff78);
          }
          local_38[0xf] = local_a0;
          if (local_38[0xf] == 0) {
            destroy((gz_stream *)in_stack_ffffffffffffff28);
            local_8 = (undefined8 *)0x0;
          }
          else {
            if (*(char *)((long)local_38 + 0xac) == 'w') {
              fprintf((FILE *)local_38[0xf],"%c%c%c%c%c%c%c%c%c%c",0x1f,0x8b,8,0,
                      (ulong)in_stack_ffffffffffffff28 & 0xffffffff00000000,0,0,0,0,3);
              local_38[0x16] = 10;
            }
            else {
              check_header((gz_stream *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
              lVar5 = ftell((FILE *)local_38[0xf]);
              local_38[0x16] = lVar5 - (ulong)*(uint *)(local_38 + 1);
            }
            local_8 = local_38;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

local gzFile gz_open (path, mode, fd)
    const char *path;
    const char *mode;
    int  fd;
{
    int err;
    int level = Z_DEFAULT_COMPRESSION; /* compression level */
    int strategy = Z_DEFAULT_STRATEGY; /* compression strategy */
    char *p = (char*)mode;
    gz_stream *s;
    char fmode[80]; /* copy of mode, without the compression level */
    char *m = fmode;

    if (!path || !mode) return Z_NULL;

    s = (gz_stream *)ALLOC(sizeof(gz_stream));
    if (!s) return Z_NULL;

    s->stream.zalloc = (alloc_func)0;
    s->stream.zfree = (free_func)0;
    s->stream.opaque = (voidpf)0;
    s->stream.next_in = s->inbuf = Z_NULL;
    s->stream.next_out = s->outbuf = Z_NULL;
    s->stream.avail_in = s->stream.avail_out = 0;
    s->file = NULL;
    s->z_err = Z_OK;
    s->z_eof = 0;
    s->in = 0;
    s->out = 0;
    s->back = EOF;
    s->crc = crc32(0L, Z_NULL, 0);
    s->msg = NULL;
    s->transparent = 0;

    s->path = (char*)ALLOC(strlen(path)+1);
    if (s->path == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    strcpy(s->path, path); /* do this early for debugging */

    s->mode = '\0';
    do {
        if (*p == 'r') s->mode = 'r';
        if (*p == 'w' || *p == 'a') s->mode = 'w';
        if (*p >= '0' && *p <= '9') {
            level = *p - '0';
        } else if (*p == 'f') {
          strategy = Z_FILTERED;
        } else if (*p == 'h') {
          strategy = Z_HUFFMAN_ONLY;
        } else if (*p == 'R') {
          strategy = Z_RLE;
        } else {
            *m++ = *p; /* copy the mode */
        }
    } while (*p++ && m != fmode + sizeof(fmode));
    if (s->mode == '\0') return destroy(s), (gzFile)Z_NULL;

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        err = Z_STREAM_ERROR;
#else
        err = deflateInit2(&(s->stream), level,
                           Z_DEFLATED, -MAX_WBITS, DEF_MEM_LEVEL, strategy);
        /* windowBits is passed < 0 to suppress zlib header */

        s->stream.next_out = s->outbuf = (Byte*)ALLOC(Z_BUFSIZE);
#endif
        if (err != Z_OK || s->outbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    } else {
        s->stream.next_in  = s->inbuf = (Byte*)ALLOC(Z_BUFSIZE);

        err = inflateInit2(&(s->stream), -MAX_WBITS);
        /* windowBits is passed < 0 to tell that there is no zlib header.
         * Note that in this case inflate *requires* an extra "dummy" byte
         * after the compressed stream in order to complete decompression and
         * return Z_STREAM_END. Here the gzip CRC32 ensures that 4 bytes are
         * present after the compressed stream.
         */
        if (err != Z_OK || s->inbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    }
    s->stream.avail_out = Z_BUFSIZE;

    errno = 0;
    s->file = fd < 0 ? F_OPEN(path, fmode) : (FILE*)fdopen(fd, fmode);

    if (s->file == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    if (s->mode == 'w') {
        /* Write a very simple .gz header:
         */
        fprintf(s->file, "%c%c%c%c%c%c%c%c%c%c", gz_magic[0], gz_magic[1],
             Z_DEFLATED, 0 /*flags*/, 0,0,0,0 /*time*/, 0 /*xflags*/, OS_CODE);
        s->start = 10L;
        /* We use 10L instead of ftell(s->file) to because ftell causes an
         * fflush on some systems. This version of the library doesn't use
         * start anyway in write mode, so this initialization is not
         * necessary.
         */
    } else {
        check_header(s); /* skip the .gz header */
        s->start = ftell(s->file) - s->stream.avail_in;
    }

    return (gzFile)s;
}